

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

wchar_t PDA::Transducer::Generator::registerSuffix(Register *source)

{
  wchar_t wVar1;
  uint uVar2;
  
  wVar1 = L'q';
  if ((source->integer == true) && (uVar2 = source->size - Half, uVar2 < 3)) {
    wVar1 = *(wchar_t *)(&DAT_00137eb0 + (ulong)uVar2 * 4);
  }
  return wVar1;
}

Assistant:

wchar_t Generator::registerSuffix(const Register &source)
{
    if (source.integer)
    {
        switch(source.size)
        {
        case Register::Size::Full:
            return L'q';
        case Register::Size::Half:
            return L'l';
        case Register::Size::Quarter:
            return L'w';
        case Register::Size::OneEight:
            return L'b';
        }
    }
    return L'q';
}